

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

void __thiscall IDLExport::closeNamespaces(IDLExport *this,ostream *stream,int levels)

{
  long lVar1;
  ostream *poVar2;
  string local_40 [32];
  int local_20;
  int local_1c;
  int i;
  int levels_local;
  ostream *stream_local;
  IDLExport *this_local;
  
  local_1c = levels;
  _i = stream;
  stream_local = (ostream *)this;
  for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
    lVar1 = std::__cxx11::string::size();
    std::__cxx11::string::string(local_40,(string *)&this->m_indent,0,lVar1 - 4);
    std::__cxx11::string::operator=((string *)&this->m_indent,local_40);
    std::__cxx11::string::~string(local_40);
    poVar2 = std::operator<<(_i,"\n");
    poVar2 = std::operator<<(poVar2,(string *)&this->m_indent);
    std::operator<<(poVar2,"};\n");
  }
  return;
}

Assistant:

void IDLExport::closeNamespaces(ostream& stream, int levels)
{
    for (int i = 0; i < levels; ++i)
    {
        m_indent = std::string(m_indent, 0, m_indent.size() - 4);
        stream << "\n" << m_indent << "};\n";
    }
}